

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForStatement.cpp
# Opt level: O2

string * __thiscall
ninx::parser::element::ForStatement::dump_abi_cxx11_
          (string *__return_storage_ptr__,ForStatement *this,int level)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Block *pBVar2;
  string *psVar3;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string *local_1c0;
  stringstream s;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&s);
  paVar1 = &local_1e0.field_2;
  local_1e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_1e0,(char)level);
  std::operator+(&local_200,&local_1e0,"ForStatement {");
  local_1c0 = __return_storage_ptr__;
  poVar4 = std::operator<<(local_1a8,(string *)&local_200);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  local_1e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_1e0,(char)(level + 1));
  std::operator+(&local_200,&local_1e0,"Iterator: ");
  poVar4 = std::operator<<(local_1a8,(string *)&local_200);
  poVar4 = std::operator<<(poVar4,(string *)&this->iterator_name);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  pBVar2 = (this->body)._M_t.
           super___uniq_ptr_impl<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
           ._M_t.
           super__Tuple_impl<0UL,_ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>
           .super__Head_base<0UL,_ninx::parser::element::Block_*,_false>._M_head_impl;
  (**(code **)(*(long *)&(pBVar2->super_Expression).super_Statement + 0x18))
            (&local_200,pBVar2,level + 1);
  poVar4 = std::operator<<(local_1a8,(string *)&local_200);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::string::~string((string *)&local_200);
  local_1e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_1e0,(char)level);
  std::operator+(&local_200,&local_1e0,"}");
  psVar3 = local_1c0;
  poVar4 = std::operator<<(local_1a8,(string *)&local_200);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&s);
  return psVar3;
}

Assistant:

std::string ninx::parser::element::ForStatement::dump(int level) const {
    std::stringstream s;

    s << std::string(level, '\t') + "ForStatement {" << std::endl;
    s << std::string(level+1, '\t') + "Iterator: " << iterator_name << std::endl;
    s << this->body->dump(level+1) << std::endl;
    s << std::string(level, '\t') + "}" << std::endl;

    return s.str();
}